

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

void do_config_merge_into(ALLEGRO_CONFIG *master,ALLEGRO_CONFIG *add,_Bool merge_comments)

{
  ALLEGRO_CONFIG_SECTION *pAVar1;
  ALLEGRO_CONFIG_ENTRY *pAVar2;
  
  if (add != (ALLEGRO_CONFIG *)0x0) {
    for (pAVar1 = add->head; pAVar1 != (ALLEGRO_CONFIG_SECTION *)0x0; pAVar1 = pAVar1->next) {
      config_add_section(master,pAVar1->name);
      for (pAVar2 = pAVar1->head; pAVar2 != (ALLEGRO_CONFIG_ENTRY *)0x0; pAVar2 = pAVar2->next) {
        if (pAVar2->is_comment == false) {
          config_set_value(master,pAVar1->name,pAVar2->key,pAVar2->value);
        }
        else if (merge_comments) {
          config_add_comment(master,pAVar1->name,pAVar2->key);
        }
      }
    }
  }
  return;
}

Assistant:

static void do_config_merge_into(ALLEGRO_CONFIG *master,
   const ALLEGRO_CONFIG *add, bool merge_comments)
{
   ALLEGRO_CONFIG_SECTION *s;
   ALLEGRO_CONFIG_ENTRY *e;
   ASSERT(master);

   if (!add) {
      return;
   }

   /* Save each section */
   s = add->head;
   while (s != NULL) {
      config_add_section(master, s->name);
      e = s->head;
      while (e != NULL) {
         if (!e->is_comment) {
            config_set_value(master, s->name, e->key, e->value);
         }
         else if (merge_comments) {
            config_add_comment(master, s->name, e->key);
         }
         e = e->next;
      }
      s = s->next;
   }
}